

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvector.cpp
# Opt level: O0

void __thiscall icu_63::UVector::_init(UVector *this,int32_t initialCapacity,UErrorCode *status)

{
  UBool UVar1;
  UElement *pUVar2;
  UErrorCode *status_local;
  int32_t initialCapacity_local;
  UVector *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    if ((initialCapacity < 1) || (status_local._4_4_ = initialCapacity, 0xfffffff < initialCapacity)
       ) {
      status_local._4_4_ = 8;
    }
    pUVar2 = (UElement *)uprv_malloc_63((long)status_local._4_4_ << 3);
    this->elements = pUVar2;
    if (this->elements == (UElement *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      this->capacity = status_local._4_4_;
    }
  }
  return;
}

Assistant:

void UVector::_init(int32_t initialCapacity, UErrorCode &status) {
    if (U_FAILURE(status)) {
        return;
    }
    // Fix bogus initialCapacity values; avoid malloc(0) and integer overflow
    if ((initialCapacity < 1) || (initialCapacity > (int32_t)(INT32_MAX / sizeof(UElement)))) {
        initialCapacity = DEFAULT_CAPACITY;
    }
    elements = (UElement *)uprv_malloc(sizeof(UElement)*initialCapacity);
    if (elements == 0) {
        status = U_MEMORY_ALLOCATION_ERROR;
    } else {
        capacity = initialCapacity;
    }
}